

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AnalyzedAssertion.cpp
# Opt level: O0

VisitResult * __thiscall
slang::analysis::ClockVisitor::visit
          (ClockVisitor *this,DisableIffAssertionExpr *expr,Clock outerClock,
          bitmask<slang::analysis::VisitFlags> flags)

{
  undefined8 *in_RSI;
  VisitResult *in_RDI;
  bitmask<slang::analysis::VisitFlags> *unaff_retaddr;
  TimingControl **in_stack_00000008;
  ClockVisitor *in_stack_00000010;
  AssertionExpr *in_stack_00000018;
  NonProceduralExprVisitor visitor;
  NonProceduralExprVisitor *in_stack_ffffffffffffffa8;
  VisitResult *this_00;
  NonProceduralExprVisitor local_38 [3];
  
  this_00 = in_RDI;
  NonProceduralExprVisitor::NonProceduralExprVisitor
            (local_38,(AnalysisContext *)*in_RSI,(Symbol *)in_RSI[2]);
  ast::Expression::visit<slang::analysis::NonProceduralExprVisitor&>
            ((Expression *)this_00,in_stack_ffffffffffffffa8);
  ast::AssertionExpr::
  visit<slang::analysis::ClockVisitor,slang::ast::TimingControl_const*&,slang::bitmask<slang::analysis::VisitFlags>&>
            (in_stack_00000018,in_stack_00000010,in_stack_00000008,unaff_retaddr);
  return in_RDI;
}

Assistant:

VisitResult visit(const DisableIffAssertionExpr& expr, Clock outerClock, bitmask<VF> flags) {
        // Our current clock doesn't flow into the disable iff condition,
        // so check it separately for explicit clocking of sequence instances
        // and calls to sampled value functions.
        NonProceduralExprVisitor visitor(context, parentSymbol);
        expr.condition.visit(visitor);

        return expr.expr.visit(*this, outerClock, flags);
    }